

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_traversal_predictive_encoder.h
# Opt level: O0

void __thiscall
draco::MeshEdgebreakerTraversalPredictiveEncoder::~MeshEdgebreakerTraversalPredictiveEncoder
          (MeshEdgebreakerTraversalPredictiveEncoder *this)

{
  MeshEdgebreakerTraversalEncoder *in_RDI;
  vector<int,_std::allocator<int>_> *unaff_retaddr;
  
  std::vector<bool,_std::allocator<bool>_>::~vector((vector<bool,_std::allocator<bool>_> *)0x1a60ef)
  ;
  std::vector<int,_std::allocator<int>_>::~vector(unaff_retaddr);
  MeshEdgebreakerTraversalEncoder::~MeshEdgebreakerTraversalEncoder(in_RDI);
  return;
}

Assistant:

MeshEdgebreakerTraversalPredictiveEncoder()
      : corner_table_(nullptr),
        prev_symbol_(-1),
        num_split_symbols_(0),
        last_corner_(kInvalidCornerIndex),
        num_symbols_(0) {}